

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void generateSortTail(Parse *pParse,Select *p,SortCtx *pSort,int nColumn,SelectDest *pDest)

{
  u8 uVar1;
  int iDest;
  int p1;
  int p1_00;
  Vdbe *p_00;
  ExprList *pEVar2;
  ExprList *pEVar3;
  int iContinue;
  int iVar4;
  int p2;
  int iVar5;
  int local_90;
  int iRead;
  int regSortOut;
  ExprList_item *aOutEx;
  int nRefKey;
  int bSeq;
  int i;
  int iSortTab;
  int nKey;
  int iCol;
  int regRowid;
  int regRow;
  int iParm;
  int eDest;
  ExprList *pOrderBy;
  int local_48;
  int iTab;
  int addrOnce;
  int addr;
  int addrContinue;
  int addrBreak;
  Vdbe *v;
  SelectDest *pDest_local;
  int nColumn_local;
  SortCtx *pSort_local;
  Select *p_local;
  Parse *pParse_local;
  
  p_00 = pParse->pVdbe;
  iDest = pSort->labelDone;
  iContinue = sqlite3VdbeMakeLabel(pParse);
  local_48 = 0;
  pEVar2 = pSort->pOrderBy;
  uVar1 = pDest->eDest;
  p1 = pDest->iSDParm;
  pEVar3 = p->pEList;
  if (pSort->labelBkOut != 0) {
    sqlite3VdbeAddOp2(p_00,0xc,pSort->regReturn,pSort->labelBkOut);
    sqlite3VdbeGoto(p_00,iDest);
    sqlite3VdbeResolveLabel(p_00,pSort->labelBkOut);
  }
  p1_00 = pSort->iECursor;
  pDest_local._4_4_ = nColumn;
  if (((uVar1 == '\t') || (uVar1 == '\r')) || (uVar1 == '\n')) {
    nKey = 0;
    iCol = pDest->iSdst;
  }
  else {
    nKey = sqlite3GetTempReg(pParse);
    if ((uVar1 == '\f') || (uVar1 == '\x0e')) {
      iCol = sqlite3GetTempReg(pParse);
      pDest_local._4_4_ = 0;
    }
    else {
      iCol = sqlite3GetTempRange(pParse,nColumn);
    }
  }
  iVar4 = pEVar2->nExpr - pSort->nOBSat;
  if ((pSort->sortFlags & 1) == 0) {
    iVar5 = sqlite3VdbeAddOp2(p_00,0x23,p1_00,iDest);
    codeOffset(p_00,p->iOffset,iContinue);
    aOutEx._4_4_ = 1;
    bSeq = p1_00;
  }
  else {
    p2 = pParse->nMem + 1;
    pParse->nMem = p2;
    bSeq = pParse->nTab;
    pParse->nTab = bSeq + 1;
    if (pSort->labelBkOut != 0) {
      local_48 = sqlite3VdbeAddOp0(p_00,0x11);
    }
    sqlite3VdbeAddOp3(p_00,0x74,bSeq,p2,iVar4 + 1 + pDest_local._4_4_);
    if (local_48 != 0) {
      sqlite3VdbeJumpHere(p_00,local_48);
    }
    iVar5 = sqlite3VdbeAddOp2(p_00,0x22,p1_00,iDest);
    codeOffset(p_00,p->iOffset,iContinue);
    sqlite3VdbeAddOp3(p_00,0x7e,p1_00,p2,bSeq);
    aOutEx._4_4_ = 0;
  }
  iTab = iVar5 + 1;
  iSortTab = iVar4 + aOutEx._4_4_ + -1;
  for (nRefKey = 0; iVar5 = pDest_local._4_4_, nRefKey < pDest_local._4_4_; nRefKey = nRefKey + 1) {
    if (pEVar3->a[nRefKey].u.x.iOrderByCol == 0) {
      iSortTab = iSortTab + 1;
    }
  }
  while (nRefKey = iVar5 + -1, -1 < nRefKey) {
    if (pEVar3->a[nRefKey].u.x.iOrderByCol == 0) {
      local_90 = iSortTab;
      iSortTab = iSortTab + -1;
    }
    else {
      local_90 = pEVar3->a[nRefKey].u.x.iOrderByCol - 1;
    }
    sqlite3VdbeAddOp3(p_00,0x5a,bSeq,local_90,iCol + nRefKey);
    iVar5 = nRefKey;
  }
  switch(uVar1) {
  case '\n':
    break;
  case '\v':
    sqlite3VdbeAddOp4(p_00,0x5c,iCol,pDest_local._4_4_,nKey,pDest->zAffSdst,pDest_local._4_4_);
    sqlite3VdbeAddOp4Int(p_00,0x84,p1,nKey,iCol,pDest_local._4_4_);
    break;
  case '\f':
  case '\x0e':
    sqlite3VdbeAddOp3(p_00,0x5a,bSeq,iVar4 + aOutEx._4_4_,iCol);
    sqlite3VdbeAddOp2(p_00,0x79,p1,nKey);
    sqlite3VdbeAddOp3(p_00,0x7a,p1,iCol,nKey);
    sqlite3VdbeChangeP5(p_00,8);
    break;
  default:
    if (uVar1 == '\t') {
      sqlite3VdbeAddOp2(p_00,0x51,pDest->iSdst,pDest_local._4_4_);
    }
    else {
      sqlite3VdbeAddOp1(p_00,0xe,pDest->iSDParm);
    }
  }
  if (nKey != 0) {
    if (uVar1 == '\v') {
      sqlite3ReleaseTempRange(pParse,iCol,pDest_local._4_4_);
    }
    else {
      sqlite3ReleaseTempReg(pParse,iCol);
    }
    sqlite3ReleaseTempReg(pParse,nKey);
  }
  sqlite3VdbeResolveLabel(p_00,iContinue);
  if ((pSort->sortFlags & 1) == 0) {
    sqlite3VdbeAddOp2(p_00,5,p1_00,iTab);
  }
  else {
    sqlite3VdbeAddOp2(p_00,3,p1_00,iTab);
  }
  if (pSort->regReturn != 0) {
    sqlite3VdbeAddOp1(p_00,0x42,pSort->regReturn);
  }
  sqlite3VdbeResolveLabel(p_00,iDest);
  return;
}

Assistant:

static void generateSortTail(
  Parse *pParse,    /* Parsing context */
  Select *p,        /* The SELECT statement */
  SortCtx *pSort,   /* Information on the ORDER BY clause */
  int nColumn,      /* Number of columns of data */
  SelectDest *pDest /* Write the sorted results here */
){
  Vdbe *v = pParse->pVdbe;                     /* The prepared statement */
  int addrBreak = pSort->labelDone;            /* Jump here to exit loop */
  int addrContinue = sqlite3VdbeMakeLabel(pParse);/* Jump here for next cycle */
  int addr;                       /* Top of output loop. Jump for Next. */
  int addrOnce = 0;
  int iTab;
  ExprList *pOrderBy = pSort->pOrderBy;
  int eDest = pDest->eDest;
  int iParm = pDest->iSDParm;
  int regRow;
  int regRowid;
  int iCol;
  int nKey;                       /* Number of key columns in sorter record */
  int iSortTab;                   /* Sorter cursor to read from */
  int i;
  int bSeq;                       /* True if sorter record includes seq. no. */
  int nRefKey = 0;
  struct ExprList_item *aOutEx = p->pEList->a;

  assert( addrBreak<0 );
  if( pSort->labelBkOut ){
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeGoto(v, addrBreak);
    sqlite3VdbeResolveLabel(v, pSort->labelBkOut);
  }

#ifdef SQLITE_ENABLE_SORTER_REFERENCES
  /* Open any cursors needed for sorter-reference expressions */
  for(i=0; i<pSort->nDefer; i++){
    Table *pTab = pSort->aDefer[i].pTab;
    int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
    sqlite3OpenTable(pParse, pSort->aDefer[i].iCsr, iDb, pTab, OP_OpenRead);
    nRefKey = MAX(nRefKey, pSort->aDefer[i].nKey);
  }
#endif

  iTab = pSort->iECursor;
  if( eDest==SRT_Output || eDest==SRT_Coroutine || eDest==SRT_Mem ){
    regRowid = 0;
    regRow = pDest->iSdst;
  }else{
    regRowid = sqlite3GetTempReg(pParse);
    if( eDest==SRT_EphemTab || eDest==SRT_Table ){
      regRow = sqlite3GetTempReg(pParse);
      nColumn = 0;
    }else{
      regRow = sqlite3GetTempRange(pParse, nColumn);
    }
  }
  nKey = pOrderBy->nExpr - pSort->nOBSat;
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    int regSortOut = ++pParse->nMem;
    iSortTab = pParse->nTab++;
    if( pSort->labelBkOut ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
    }
    sqlite3VdbeAddOp3(v, OP_OpenPseudo, iSortTab, regSortOut, 
        nKey+1+nColumn+nRefKey);
    if( addrOnce ) sqlite3VdbeJumpHere(v, addrOnce);
    addr = 1 + sqlite3VdbeAddOp2(v, OP_SorterSort, iTab, addrBreak);
    VdbeCoverage(v);
    codeOffset(v, p->iOffset, addrContinue);
    sqlite3VdbeAddOp3(v, OP_SorterData, iTab, regSortOut, iSortTab);
    bSeq = 0;
  }else{
    addr = 1 + sqlite3VdbeAddOp2(v, OP_Sort, iTab, addrBreak); VdbeCoverage(v);
    codeOffset(v, p->iOffset, addrContinue);
    iSortTab = iTab;
    bSeq = 1;
  }
  for(i=0, iCol=nKey+bSeq-1; i<nColumn; i++){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( aOutEx[i].bSorterRef ) continue;
#endif
    if( aOutEx[i].u.x.iOrderByCol==0 ) iCol++;
  }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
  if( pSort->nDefer ){
    int iKey = iCol+1;
    int regKey = sqlite3GetTempRange(pParse, nRefKey);

    for(i=0; i<pSort->nDefer; i++){
      int iCsr = pSort->aDefer[i].iCsr;
      Table *pTab = pSort->aDefer[i].pTab;
      int nKey = pSort->aDefer[i].nKey;

      sqlite3VdbeAddOp1(v, OP_NullRow, iCsr);
      if( HasRowid(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iKey++, regKey);
        sqlite3VdbeAddOp3(v, OP_SeekRowid, iCsr, 
            sqlite3VdbeCurrentAddr(v)+1, regKey);
      }else{
        int k;
        int iJmp;
        assert( sqlite3PrimaryKeyIndex(pTab)->nKeyCol==nKey );
        for(k=0; k<nKey; k++){
          sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iKey++, regKey+k);
        }
        iJmp = sqlite3VdbeCurrentAddr(v);
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, iCsr, iJmp+2, regKey, nKey);
        sqlite3VdbeAddOp4Int(v, OP_IdxLE, iCsr, iJmp+3, regKey, nKey);
        sqlite3VdbeAddOp1(v, OP_NullRow, iCsr);
      }
    }
    sqlite3ReleaseTempRange(pParse, regKey, nRefKey);
  }
#endif
  for(i=nColumn-1; i>=0; i--){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( aOutEx[i].bSorterRef ){
      sqlite3ExprCode(pParse, aOutEx[i].pExpr, regRow+i);
    }else
#endif
    {
      int iRead;
      if( aOutEx[i].u.x.iOrderByCol ){
        iRead = aOutEx[i].u.x.iOrderByCol-1;
      }else{
        iRead = iCol--;
      }
      sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iRead, regRow+i);
      VdbeComment((v, "%s", aOutEx[i].zName?aOutEx[i].zName : aOutEx[i].zSpan));
    }
  }
  switch( eDest ){
    case SRT_Table:
    case SRT_EphemTab: {
      sqlite3VdbeAddOp3(v, OP_Column, iSortTab, nKey+bSeq, regRow);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iParm, regRow, regRowid);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case SRT_Set: {
      assert( nColumn==sqlite3Strlen30(pDest->zAffSdst) );
      sqlite3VdbeAddOp4(v, OP_MakeRecord, regRow, nColumn, regRowid,
                        pDest->zAffSdst, nColumn);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, regRowid, regRow, nColumn);
      break;
    }
    case SRT_Mem: {
      /* The LIMIT clause will terminate the loop for us */
      break;
    }
#endif
    default: {
      assert( eDest==SRT_Output || eDest==SRT_Coroutine ); 
      testcase( eDest==SRT_Output );
      testcase( eDest==SRT_Coroutine );
      if( eDest==SRT_Output ){
        sqlite3VdbeAddOp2(v, OP_ResultRow, pDest->iSdst, nColumn);
      }else{
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }
      break;
    }
  }
  if( regRowid ){
    if( eDest==SRT_Set ){
      sqlite3ReleaseTempRange(pParse, regRow, nColumn);
    }else{
      sqlite3ReleaseTempReg(pParse, regRow);
    }
    sqlite3ReleaseTempReg(pParse, regRowid);
  }
  /* The bottom of the loop
  */
  sqlite3VdbeResolveLabel(v, addrContinue);
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    sqlite3VdbeAddOp2(v, OP_SorterNext, iTab, addr); VdbeCoverage(v);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addr); VdbeCoverage(v);
  }
  if( pSort->regReturn ) sqlite3VdbeAddOp1(v, OP_Return, pSort->regReturn);
  sqlite3VdbeResolveLabel(v, addrBreak);
}